

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O3

void __thiscall
sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode::~CacheNode(CacheNode *this)

{
  LRUCache<sjtu::TrainManager::stationNameType> *pLVar1;
  Node *pNVar2;
  long lVar3;
  iterator local_20;
  
  if (this->is_dirty_page == true) {
    pLVar1 = this->bel;
    std::ostream::seekp(pLVar1->file + 0x10,this->offset,0);
    std::ostream::write((char *)(pLVar1->file + 0x10),(long)this);
  }
  pNVar2 = (this->bel->table).nil;
  local_20.cor = &this->bel->table;
  local_20.ptr = pNVar2->left;
  if (local_20.ptr != pNVar2) {
    do {
      lVar3 = (local_20.ptr)->value->first;
      if (lVar3 == this->offset) break;
      local_20.ptr = (&(local_20.ptr)->left)[lVar3 <= this->offset];
    } while (local_20.ptr != pNVar2);
  }
  map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>::
  erase(local_20.cor,&local_20);
  return;
}

Assistant:

~CacheNode()
			{
				if (is_dirty_page) bel -> f_write(offset , value);
				bel -> table.erase(bel -> table.find(offset));
			}